

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parcor_coefficients_to_linear_predictive_coefficients.cc
# Opt level: O1

bool __thiscall
sptk::ParcorCoefficientsToLinearPredictiveCoefficients::Run
          (ParcorCoefficientsToLinearPredictiveCoefficients *this,
          vector<double,_std::allocator<double>_> *parcor_coefficients,
          vector<double,_std::allocator<double>_> *linear_predictive_coefficients,Buffer *buffer)

{
  uint uVar1;
  double *__src;
  pointer pdVar2;
  pointer pdVar3;
  pointer pdVar4;
  size_t __n;
  bool bVar5;
  size_type __new_size;
  long lVar6;
  long lVar7;
  int m;
  long lVar8;
  long lVar9;
  vector<double,_std::allocator<double>_> *this_00;
  
  if (this->is_valid_ == true) {
    bVar5 = false;
    if (((buffer != (Buffer *)0x0) &&
        (bVar5 = false,
        linear_predictive_coefficients != (vector<double,_std::allocator<double>_> *)0x0)) &&
       (__new_size = (long)this->num_order_ + 1,
       (long)(parcor_coefficients->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_finish -
       (long)(parcor_coefficients->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start >> 3 == __new_size)) {
      if ((long)(linear_predictive_coefficients->super__Vector_base<double,_std::allocator<double>_>
                )._M_impl.super__Vector_impl_data._M_finish -
          (long)(linear_predictive_coefficients->super__Vector_base<double,_std::allocator<double>_>
                )._M_impl.super__Vector_impl_data._M_start >> 3 != __new_size) {
        std::vector<double,_std::allocator<double>_>::resize
                  (linear_predictive_coefficients,__new_size);
      }
      this_00 = &buffer->a_;
      if ((long)(buffer->a_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(buffer->a_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start >> 3 != (long)this->num_order_) {
        std::vector<double,_std::allocator<double>_>::resize(this_00,(long)this->num_order_);
      }
      __src = (parcor_coefficients->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_start;
      *(linear_predictive_coefficients->super__Vector_base<double,_std::allocator<double>_>)._M_impl
       .super__Vector_impl_data._M_start = *__src;
      bVar5 = true;
      if (this->num_order_ != 0) {
        __n = (long)(parcor_coefficients->super__Vector_base<double,_std::allocator<double>_>).
                    _M_impl.super__Vector_impl_data._M_finish + (-8 - (long)__src);
        if (__n != 0) {
          memmove((this_00->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                  super__Vector_impl_data._M_start,__src,__n);
        }
        pdVar2 = (parcor_coefficients->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        pdVar3 = (linear_predictive_coefficients->
                 super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        uVar1 = this->num_order_;
        if (1 < (int)uVar1) {
          pdVar4 = (this_00->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          lVar6 = 2;
          lVar7 = 8;
          do {
            lVar8 = 1;
            lVar9 = lVar7;
            do {
              pdVar3[lVar8] = pdVar2[lVar6] * *(double *)((long)pdVar4 + lVar9) + pdVar4[lVar8];
              lVar8 = lVar8 + 1;
              lVar9 = lVar9 + -8;
            } while (lVar9 != 0);
            lVar9 = 0;
            do {
              *(undefined8 *)((long)pdVar4 + lVar9 + 8) = *(undefined8 *)((long)pdVar3 + lVar9 + 8);
              lVar9 = lVar9 + 8;
            } while (lVar7 != lVar9);
            lVar6 = lVar6 + 1;
            lVar7 = lVar7 + 8;
          } while (lVar6 != (ulong)uVar1 + 1);
        }
        pdVar3[(int)uVar1] = pdVar2[(int)uVar1];
      }
    }
  }
  else {
    bVar5 = false;
  }
  return bVar5;
}

Assistant:

bool ParcorCoefficientsToLinearPredictiveCoefficients::Run(
    const std::vector<double>& parcor_coefficients,
    std::vector<double>* linear_predictive_coefficients,
    ParcorCoefficientsToLinearPredictiveCoefficients::Buffer* buffer) const {
  // Check inputs.
  const int length(num_order_ + 1);
  if (!is_valid_ ||
      parcor_coefficients.size() != static_cast<std::size_t>(length) ||
      NULL == linear_predictive_coefficients || NULL == buffer) {
    return false;
  }

  // Prepare memories.
  if (linear_predictive_coefficients->size() !=
      static_cast<std::size_t>(length)) {
    linear_predictive_coefficients->resize(length);
  }
  if (buffer->a_.size() != static_cast<std::size_t>(num_order_)) {
    buffer->a_.resize(num_order_);
  }

  // Copy gain.
  (*linear_predictive_coefficients)[0] = parcor_coefficients[0];
  if (0 == num_order_) {
    return true;
  }

  // Set initial condition.
  std::copy(parcor_coefficients.begin(), parcor_coefficients.end() - 1,
            buffer->a_.begin());

  // Apply recursive formula.
  const double* k(&(parcor_coefficients[0]));
  double* prev_a(&buffer->a_[0]);
  double* a(&((*linear_predictive_coefficients)[0]));
  for (int i(2); i <= num_order_; ++i) {
    for (int m(1); m < i; ++m) {
      a[m] = prev_a[m] + k[i] * prev_a[i - m];
    }
    for (int m(1); m < i; ++m) {
      prev_a[m] = a[m];
    }
  }
  a[num_order_] = k[num_order_];

  return true;
}